

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O0

void Test_TemplateModifiers_ValidateImgSrcUrlJavascriptEscape::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  TemplateString TVar14;
  TemplateString TVar15;
  TemplateString TVar16;
  TemplateString TVar17;
  TemplateString TVar18;
  TemplateString TVar19;
  TemplateString TVar20;
  int iVar21;
  char *pcVar22;
  TemplateString local_470;
  TemplateString local_450;
  TemplateString local_430;
  TemplateString local_410;
  TemplateString local_3f0;
  TemplateString local_3d0;
  TemplateString local_3b0;
  TemplateString local_390;
  TemplateString local_370;
  TemplateString local_350;
  TemplateDictionaryPeer local_330;
  TemplateDictionaryPeer peer;
  size_t sStack_320;
  undefined8 local_318;
  TemplateId TStack_310;
  TemplateString local_308;
  TemplateString local_2e8;
  TemplateString local_2c8;
  TemplateString local_2a8;
  TemplateString local_288;
  TemplateString local_268;
  TemplateString local_248;
  TemplateString local_228;
  TemplateString local_208;
  TemplateString local_1e8;
  TemplateString local_1c8;
  TemplateString local_1a8;
  TemplateString local_188;
  TemplateString local_168;
  TemplateString local_148;
  TemplateString local_128;
  TemplateString local_108;
  TemplateString local_e8;
  TemplateString local_b8;
  TemplateString local_98;
  TemplateDictionary local_78 [8];
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString(&local_98,"TestValidateImgSrcUrlJavascriptEscape");
  ctemplate::TemplateDictionary::TemplateDictionary(local_78,&local_98,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_b8,"easy http URL");
  ctemplate::TemplateString::TemplateString(&local_e8,"http://www.google.com");
  TVar1.length_ = local_b8.length_;
  TVar1.ptr_ = local_b8.ptr_;
  TVar1.is_immutable_ = local_b8.is_immutable_;
  TVar1._17_7_ = local_b8._17_7_;
  TVar1.id_ = local_b8.id_;
  TVar11.length_ = local_e8.length_;
  TVar11.ptr_ = local_e8.ptr_;
  TVar11.is_immutable_ = local_e8.is_immutable_;
  TVar11._17_7_ = local_e8._17_7_;
  TVar11.id_ = local_e8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar1,TVar11,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_108,"harder https URL");
  ctemplate::TemplateString::TemplateString(&local_128,"https://www.google.com/search?q=f&hl=en");
  TVar2.length_ = local_108.length_;
  TVar2.ptr_ = local_108.ptr_;
  TVar2.is_immutable_ = local_108.is_immutable_;
  TVar2._17_7_ = local_108._17_7_;
  TVar2.id_ = local_108.id_;
  TVar12.length_ = local_128.length_;
  TVar12.ptr_ = local_128.ptr_;
  TVar12.is_immutable_ = local_128.is_immutable_;
  TVar12._17_7_ = local_128._17_7_;
  TVar12.id_ = local_128.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar2,TVar12,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_148,"mangled http URL");
  ctemplate::TemplateString::TemplateString(&local_168,"HTTP://www.google.com");
  TVar3.length_ = local_148.length_;
  TVar3.ptr_ = local_148.ptr_;
  TVar3.is_immutable_ = local_148.is_immutable_;
  TVar3._17_7_ = local_148._17_7_;
  TVar3.id_ = local_148.id_;
  TVar13.length_ = local_168.length_;
  TVar13.ptr_ = local_168.ptr_;
  TVar13.is_immutable_ = local_168.is_immutable_;
  TVar13._17_7_ = local_168._17_7_;
  TVar13.id_ = local_168.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar3,TVar13,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_188,"easy javascript URL");
  ctemplate::TemplateString::TemplateString(&local_1a8,"javascript:alert(document.cookie)");
  TVar4.length_ = local_188.length_;
  TVar4.ptr_ = local_188.ptr_;
  TVar4.is_immutable_ = local_188.is_immutable_;
  TVar4._17_7_ = local_188._17_7_;
  TVar4.id_ = local_188.id_;
  TVar14.length_ = local_1a8.length_;
  TVar14.ptr_ = local_1a8.ptr_;
  TVar14.is_immutable_ = local_1a8.is_immutable_;
  TVar14._17_7_ = local_1a8._17_7_;
  TVar14.id_ = local_1a8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar4,TVar14,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_1c8,"harder javascript URL");
  ctemplate::TemplateString::TemplateString(&local_1e8,"javascript:alert(10/5)");
  TVar5.length_ = local_1c8.length_;
  TVar5.ptr_ = local_1c8.ptr_;
  TVar5.is_immutable_ = local_1c8.is_immutable_;
  TVar5._17_7_ = local_1c8._17_7_;
  TVar5.id_ = local_1c8.id_;
  TVar15.length_ = local_1e8.length_;
  TVar15.ptr_ = local_1e8.ptr_;
  TVar15.is_immutable_ = local_1e8.is_immutable_;
  TVar15._17_7_ = local_1e8._17_7_;
  TVar15.id_ = local_1e8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar5,TVar15,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_208,"easy relative URL");
  ctemplate::TemplateString::TemplateString(&local_228,"foobar.html");
  TVar6.length_ = local_208.length_;
  TVar6.ptr_ = local_208.ptr_;
  TVar6.is_immutable_ = local_208.is_immutable_;
  TVar6._17_7_ = local_208._17_7_;
  TVar6.id_ = local_208.id_;
  TVar16.length_ = local_228.length_;
  TVar16.ptr_ = local_228.ptr_;
  TVar16.is_immutable_ = local_228.is_immutable_;
  TVar16._17_7_ = local_228._17_7_;
  TVar16.id_ = local_228.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar6,TVar16,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_248,"harder relative URL");
  ctemplate::TemplateString::TemplateString(&local_268,"/search?q=green flowers&hl=en");
  TVar7.length_ = local_248.length_;
  TVar7.ptr_ = local_248.ptr_;
  TVar7.is_immutable_ = local_248.is_immutable_;
  TVar7._17_7_ = local_248._17_7_;
  TVar7.id_ = local_248.id_;
  TVar17.length_ = local_268.length_;
  TVar17.ptr_ = local_268.ptr_;
  TVar17.is_immutable_ = local_268.is_immutable_;
  TVar17._17_7_ = local_268._17_7_;
  TVar17.id_ = local_268.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar7,TVar17,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_288,"data URL");
  ctemplate::TemplateString::TemplateString(&local_2a8,"data: text/html");
  TVar8.length_ = local_288.length_;
  TVar8.ptr_ = local_288.ptr_;
  TVar8.is_immutable_ = local_288.is_immutable_;
  TVar8._17_7_ = local_288._17_7_;
  TVar8.id_ = local_288.id_;
  TVar18.length_ = local_2a8.length_;
  TVar18.ptr_ = local_2a8.ptr_;
  TVar18.is_immutable_ = local_2a8.is_immutable_;
  TVar18._17_7_ = local_2a8._17_7_;
  TVar18.id_ = local_2a8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar8,TVar18,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_2c8,"mangled javascript URL");
  ctemplate::TemplateString::TemplateString(&local_2e8,"javaSCRIPT:alert(5)");
  TVar9.length_ = local_2c8.length_;
  TVar9.ptr_ = local_2c8.ptr_;
  TVar9.is_immutable_ = local_2c8.is_immutable_;
  TVar9._17_7_ = local_2c8._17_7_;
  TVar9.id_ = local_2c8.id_;
  TVar19.length_ = local_2e8.length_;
  TVar19.ptr_ = local_2e8.ptr_;
  TVar19.is_immutable_ = local_2e8.is_immutable_;
  TVar19._17_7_ = local_2e8._17_7_;
  TVar19.id_ = local_2e8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar9,TVar19,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_308,"harder mangled javascript URL");
  ctemplate::TemplateString::TemplateString((TemplateString *)&peer,"java\nSCRIPT:alert(5)");
  TVar10.length_ = local_308.length_;
  TVar10.ptr_ = local_308.ptr_;
  TVar10.is_immutable_ = local_308.is_immutable_;
  TVar10._17_7_ = local_308._17_7_;
  TVar10.id_ = local_308.id_;
  TVar20.length_ = sStack_320;
  TVar20.ptr_ = (char *)peer.dict_;
  TVar20._16_8_ = local_318;
  TVar20.id_ = TStack_310;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar10,TVar20,(TemplateModifier *)local_78);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_330,local_78);
  ctemplate::TemplateString::TemplateString(&local_350,"easy http URL");
  pcVar22 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_330,&local_350);
  iVar21 = strcmp(pcVar22,"http://www.google.com");
  if (iVar21 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"easy http URL\"), \"http://www.google.com\") == 0");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_370,"harder https URL");
  pcVar22 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_330,&local_370);
  iVar21 = strcmp(pcVar22,"https://www.google.com/search?q\\x3df\\x26hl\\x3den");
  if (iVar21 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"harder https URL\"), \"https://www.google.com/search?q\\\\x3df\\\\x26hl\\\\x3den\") == 0"
           );
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_390,"mangled http URL");
  pcVar22 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_330,&local_390);
  iVar21 = strcmp(pcVar22,"HTTP://www.google.com");
  if (iVar21 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"mangled http URL\"), \"HTTP://www.google.com\") == 0");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_3b0,"easy javascript URL");
  pcVar22 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_330,&local_3b0);
  iVar21 = strcmp(pcVar22,ctemplate::ValidateUrl::kUnsafeImgSrcUrlReplacement);
  if (iVar21 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"easy javascript URL\"), ctemplate::ValidateUrl::kUnsafeImgSrcUrlReplacement) == 0"
           );
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_3d0,"harder javascript URL");
  pcVar22 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_330,&local_3d0);
  iVar21 = strcmp(pcVar22,ctemplate::ValidateUrl::kUnsafeImgSrcUrlReplacement);
  if (iVar21 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"harder javascript URL\"), ctemplate::ValidateUrl::kUnsafeImgSrcUrlReplacement) == 0"
           );
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_3f0,"easy relative URL");
  pcVar22 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_330,&local_3f0);
  iVar21 = strcmp(pcVar22,"foobar.html");
  if (iVar21 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"easy relative URL\"), \"foobar.html\") == 0");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_410,"harder relative URL");
  pcVar22 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_330,&local_410);
  iVar21 = strcmp(pcVar22,"/search?q\\x3dgreen flowers\\x26hl\\x3den");
  if (iVar21 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"harder relative URL\"), \"/search?q\\\\x3dgreen flowers\\\\x26hl\\\\x3den\") == 0"
           );
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_430,"data URL");
  pcVar22 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_330,&local_430);
  iVar21 = strcmp(pcVar22,"/images/cleardot.gif");
  if (iVar21 == 0) {
    ctemplate::TemplateString::TemplateString(&local_450,"mangled javascript URL");
    pcVar22 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_330,&local_450);
    iVar21 = strcmp(pcVar22,ctemplate::ValidateUrl::kUnsafeImgSrcUrlReplacement);
    if (iVar21 != 0) {
      fprintf(_stderr,"Check failed: %s\n",
              "strcmp(peer.GetSectionValue(\"mangled javascript URL\"), ctemplate::ValidateUrl::kUnsafeImgSrcUrlReplacement) == 0"
             );
      exit(1);
    }
    ctemplate::TemplateString::TemplateString(&local_470,"harder mangled javascript URL");
    pcVar22 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_330,&local_470);
    iVar21 = strcmp(pcVar22,ctemplate::ValidateUrl::kUnsafeImgSrcUrlReplacement);
    if (iVar21 == 0) {
      ctemplate::TemplateDictionary::~TemplateDictionary(local_78);
      return;
    }
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"harder mangled javascript URL\"), ctemplate::ValidateUrl::kUnsafeImgSrcUrlReplacement) == 0"
           );
    exit(1);
  }
  fprintf(_stderr,"Check failed: %s\n",
          "strcmp(peer.GetSectionValue(\"data URL\"), \"/images/cleardot.gif\") == 0");
  exit(1);
}

Assistant:

TEST(TemplateModifiers, ValidateImgSrcUrlJavascriptEscape) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestValidateImgSrcUrlJavascriptEscape", NULL);
  dict.SetEscapedValue(
      "easy http URL", "http://www.google.com",
      GOOGLE_NAMESPACE::validate_img_src_url_and_javascript_escape);
  dict.SetEscapedValue(
      "harder https URL",
      "https://www.google.com/search?q=f&hl=en",
      GOOGLE_NAMESPACE::validate_img_src_url_and_javascript_escape);
  dict.SetEscapedValue(
      "mangled http URL", "HTTP://www.google.com",
      GOOGLE_NAMESPACE::validate_img_src_url_and_javascript_escape);
  dict.SetEscapedValue(
      "easy javascript URL",
      "javascript:alert(document.cookie)",
      GOOGLE_NAMESPACE::validate_img_src_url_and_javascript_escape);
  dict.SetEscapedValue(
      "harder javascript URL",
      "javascript:alert(10/5)",
      GOOGLE_NAMESPACE::validate_img_src_url_and_javascript_escape);
  dict.SetEscapedValue(
      "easy relative URL",
      "foobar.html",
      GOOGLE_NAMESPACE::validate_img_src_url_and_javascript_escape);
  dict.SetEscapedValue(
      "harder relative URL",
      "/search?q=green flowers&hl=en",
      GOOGLE_NAMESPACE::validate_img_src_url_and_javascript_escape);
  dict.SetEscapedValue(
      "data URL",
      "data: text/html",
      GOOGLE_NAMESPACE::validate_img_src_url_and_javascript_escape);
  dict.SetEscapedValue(
      "mangled javascript URL",
      "javaSCRIPT:alert(5)",
      GOOGLE_NAMESPACE::validate_img_src_url_and_javascript_escape);
  dict.SetEscapedValue(
      "harder mangled javascript URL",
      "java\nSCRIPT:alert(5)",
      GOOGLE_NAMESPACE::validate_img_src_url_and_javascript_escape);


  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("easy http URL"),
               "http://www.google.com");
  EXPECT_STREQ(peer.GetSectionValue("harder https URL"),
               "https://www.google.com/search?q\\x3df\\x26hl\\x3den");
  EXPECT_STREQ(peer.GetSectionValue("mangled http URL"),
               "HTTP://www.google.com");
  EXPECT_STREQ(peer.GetSectionValue("easy javascript URL"),
               GOOGLE_NAMESPACE::ValidateUrl::kUnsafeImgSrcUrlReplacement);
  EXPECT_STREQ(peer.GetSectionValue("harder javascript URL"),
               GOOGLE_NAMESPACE::ValidateUrl::kUnsafeImgSrcUrlReplacement);
  EXPECT_STREQ(peer.GetSectionValue("easy relative URL"),
               "foobar.html");
  EXPECT_STREQ(peer.GetSectionValue("harder relative URL"),
               "/search?q\\x3dgreen flowers\\x26hl\\x3den");
  EXPECT_STREQ(peer.GetSectionValue("data URL"),
               "/images/cleardot.gif");
  EXPECT_STREQ(peer.GetSectionValue("mangled javascript URL"),
               GOOGLE_NAMESPACE::ValidateUrl::kUnsafeImgSrcUrlReplacement);
  EXPECT_STREQ(peer.GetSectionValue("harder mangled javascript URL"),
               GOOGLE_NAMESPACE::ValidateUrl::kUnsafeImgSrcUrlReplacement);
}